

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O3

void slept_monst(monst *mon)

{
  boolean bVar1;
  char *pcVar2;
  
  if (((*(uint *)&mon->field_0x60 & 0xc0000) != 0x40000) && (u.ustuck == mon)) {
    bVar1 = sticks(youmonst.data);
    if ((bVar1 == '\0') && ((u._1052_1_ & 1) == 0)) {
      pcVar2 = Monnam(mon);
      pcVar2 = s_suffix(pcVar2);
      pline("%s grip relaxes.",pcVar2);
      unstuck(mon);
      return;
    }
  }
  return;
}

Assistant:

void slept_monst(struct monst *mon)
{
	if ((mon->msleeping || !mon->mcanmove) && mon == u.ustuck &&
		!sticks(youmonst.data) && !u.uswallow) {
	    pline("%s grip relaxes.", s_suffix(Monnam(mon)));
	    unstuck(mon);
	}
}